

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlnObj.c
# Opt level: O2

int Wln_ObjClone(Wln_Ntk_t *pNew,Wln_Ntk_t *p,int iObj)

{
  char cVar1;
  Hash_IntMan_t *pHVar2;
  int iVar3;
  int iVar4;
  int i;
  Hash_IntObj_t *pHVar5;
  
  iVar3 = Vec_IntEntry(&p->vTypes,iObj);
  if ((-1 < iObj) && (iObj < (p->vSigns).nSize)) {
    pHVar2 = p->pRanges;
    cVar1 = (p->vSigns).pArray[(uint)iObj];
    iVar4 = Vec_IntEntry(&p->vRanges,iObj);
    pHVar5 = Hash_IntObj(pHVar2,iVar4);
    iVar4 = pHVar5->iData0;
    pHVar2 = p->pRanges;
    i = Vec_IntEntry(&p->vRanges,iObj);
    pHVar5 = Hash_IntObj(pHVar2,i);
    iVar3 = Wln_ObjAlloc(pNew,iVar3,(int)cVar1,iVar4,pHVar5->iData1);
    return iVar3;
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecStr.h"
                ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
}

Assistant:

int Wln_ObjClone( Wln_Ntk_t * pNew, Wln_Ntk_t * p, int iObj )
{
    return Wln_ObjAlloc( pNew, Wln_ObjType(p, iObj), Wln_ObjIsSigned(p, iObj), Wln_ObjRangeEnd(p, iObj), Wln_ObjRangeBeg(p, iObj) );
}